

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetSourceFiles
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files,
          string *config)

{
  KindedSources *pKVar1;
  pointer __x;
  pointer sourceName;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar2;
  cmSourceFile *sf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  cmSourceFile *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  local_58;
  
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetSourceFiles(this,&local_78,config);
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    for (sourceName = local_78.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        sourceName !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; sourceName = sourceName + 1) {
      local_80 = cmMakefile::GetOrCreateSource(this->Makefile,sourceName,false);
      pVar2 = std::
              _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
              ::_M_insert_unique<cmSourceFile*const&>
                        ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                          *)&local_58,&local_80);
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(files,&local_80);
      }
    }
    std::
    _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
    ::~_Rb_tree(&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
  }
  else {
    pKVar1 = GetKindedSources(this,config);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::reserve
              (files,(long)(pKVar1->Sources).
                           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pKVar1->Sources).
                           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
    for (__x = (pKVar1->Sources).
               super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
               ._M_impl.super__Vector_impl_data._M_start;
        __x != (pKVar1->Sources).
               super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
               ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(files,&__x->Source);
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetSourceFiles(std::vector<cmSourceFile*>& files,
                                       const std::string& config) const
{
  if (!this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    // Since we are still configuring not all sources may exist yet,
    // so we need to avoid full source classification because that
    // requires the absolute paths to all sources to be determined.
    // Since this is only for compatibility with old policies that
    // projects should not depend on anymore, just compute the files
    // without memoizing them.
    std::vector<std::string> srcs;
    this->GetSourceFiles(srcs, config);
    std::set<cmSourceFile*> emitted;
    for (std::vector<std::string>::const_iterator i = srcs.begin();
         i != srcs.end(); ++i) {
      cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
      if (emitted.insert(sf).second) {
        files.push_back(sf);
      }
    }
    return;
  }

  KindedSources const& kinded = this->GetKindedSources(config);
  files.reserve(kinded.Sources.size());
  for (std::vector<SourceAndKind>::const_iterator si = kinded.Sources.begin();
       si != kinded.Sources.end(); ++si) {
    files.push_back(si->Source);
  }
}